

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::ContStack::Print(ContStack *this,DebugWriter *w,Char *input)

{
  Cont *pCVar1;
  undefined1 local_40 [8];
  Iterator it;
  
  local_40 = (undefined1  [8])
             (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
  it.super_Iterator.nextTop =
       (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize;
  if (local_40 != (undefined1  [8])0x0) {
    it.topElementSize = (size_t)this;
    do {
      DebugWriter::Print(w,L"%4llu: ");
      pCVar1 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator*
                         ((Iterator *)local_40);
      (**pCVar1->_vptr_Cont)(pCVar1,w,input);
      ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator++
                ((Iterator *)local_40);
    } while (local_40 != (undefined1  [8])0x0);
  }
  return;
}

Assistant:

void ContStack::Print(DebugWriter* w, const Char* const input) const
    {
        for (Iterator it(*this); it; ++it)
        {
            w->Print(_u("%4llu: "), static_cast<unsigned long long>(it.Position()));
            it->Print(w, input);
        }
    }